

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::dnegate(Forth *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,2,"DNEGATE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  lVar3 = ((ulong)-uVar2 << 0x20) - (ulong)uVar1;
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)lVar3);
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)((ulong)lVar3 >> 0x20));
  return;
}

Assistant:

void dnegate(){
			REQUIRE_DSTACK_DEPTH(2, "DNEGATE");
			DCell d1(dStack.getTop(1), dStack.getTop());
			d1.data_.SDcells = -d1.data_.SDcells;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}